

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O0

void __thiscall cmInstallGenerator::GenerateScript(cmInstallGenerator *this,ostream *os)

{
  ulong uVar1;
  ostream *poVar2;
  uint local_58;
  undefined1 local_40 [8];
  string component_test;
  Indent indent;
  ostream *os_local;
  cmInstallGenerator *this_local;
  
  cmScriptGeneratorIndent::cmScriptGeneratorIndent
            ((cmScriptGeneratorIndent *)((long)&component_test.field_2 + 0xc));
  CreateComponentTest((string *)local_40,this,&this->Component,(bool)(this->ExcludeFromAll & 1),
                      (bool)(this->AllComponents & 1));
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = ::operator<<(os,(cmScriptGeneratorIndent)component_test.field_2._12_4_);
    poVar2 = std::operator<<(poVar2,"if(");
    poVar2 = std::operator<<(poVar2,(string *)local_40);
    std::operator<<(poVar2,")\n");
  }
  if ((this->AllComponents & 1U) == 0) {
    local_58 = (uint)cmScriptGeneratorIndent::Next
                               ((cmScriptGeneratorIndent *)((long)&component_test.field_2 + 0xc),2);
  }
  else {
    local_58 = component_test.field_2._12_4_;
  }
  (*(this->super_cmScriptGenerator)._vptr_cmScriptGenerator[3])(this,os,(ulong)local_58);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = ::operator<<(os,(cmScriptGeneratorIndent)component_test.field_2._12_4_);
    std::operator<<(poVar2,"endif()\n\n");
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmInstallGenerator::GenerateScript(std::ostream& os)
{
  // Track indentation.
  Indent indent;

  std::string component_test = this->CreateComponentTest(
    this->Component, this->ExcludeFromAll, this->AllComponents);

  // Begin this block of installation.
  if (!component_test.empty()) {
    os << indent << "if(" << component_test << ")\n";
  }

  // Generate the script possibly with per-configuration code.
  this->GenerateScriptConfigs(os,
                              this->AllComponents ? indent : indent.Next());

  // End this block of installation.
  if (!component_test.empty()) {
    os << indent << "endif()\n\n";
  }
}